

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

bool TestHashList<unsigned_long>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes,bool drawDiagram,
               bool testCollision,bool testDist,bool testHighBits,bool testLowBits)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  size_type sVar11;
  reference pvVar12;
  uint in_ECX;
  uint in_EDX;
  undefined4 in_ESI;
  int iVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  uint in_R8D;
  byte in_R9B;
  double dVar14;
  double dVar15;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> revhashes;
  HashSet<unsigned_long> collisions;
  double collcount;
  double expected;
  size_t count;
  bool result;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffef8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff10;
  undefined1 *puVar16;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff50;
  ulong local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  undefined1 local_58 [15];
  undefined1 in_stack_ffffffffffffffb7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb8;
  bool local_e;
  
  uVar2 = in_ECX & 1;
  uVar1 = in_R8D & 1;
  local_e = true;
  if ((in_EDX & 1) != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI);
    dVar14 = EstimateNbCollisions
                       ((int)((ulong)in_stack_ffffffffffffff10._M_current >> 0x20),
                        (int)in_stack_ffffffffffffff10._M_current);
    printf("Testing collisions (%3i-bit)     - Expected %12.1f, ",dVar14,0x40);
    puVar16 = local_58;
    HashSet<unsigned_long>::HashSet((HashSet<unsigned_long> *)0x14f383);
    iVar13 = (int)((ulong)puVar16 >> 0x20);
    iVar10 = FindCollisions<unsigned_long>
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        CONCAT44(in_ECX,in_R8D),
                        (HashSet<unsigned_long> *)
                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),iVar13);
    dVar15 = (double)iVar10;
    printf("actual %6i (%.2fx)",dVar15 / dVar14,CONCAT44(iVar13,(int)dVar15));
    if (0.0 < dVar15) {
      printf(" !!!!!");
    }
    local_e = 0.0 >= dVar15;
    printf("\n");
    if (uVar1 != 0) {
      bVar3 = CountHighbitsCollisions<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(iVar10,in_stack_ffffffffffffff38),(int)((ulong)puVar16 >> 0x20));
      bVar4 = CountHighbitsCollisions<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(iVar10,in_stack_ffffffffffffff38),(int)((ulong)puVar16 >> 0x20));
      bVar5 = CountHighbitsCollisions<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(iVar10,in_stack_ffffffffffffff38),(int)((ulong)puVar16 >> 0x20));
      bVar6 = CountHighbitsCollisions<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(iVar10,in_stack_ffffffffffffff38),(int)((ulong)puVar16 >> 0x20));
      bVar7 = TestHighbitsCollisions<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(iVar10,in_stack_ffffffffffffff38));
      bVar8 = CountHighbitsCollisions<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(iVar10,in_stack_ffffffffffffff38),(int)((ulong)puVar16 >> 0x20));
      bVar9 = CountHighbitsCollisions<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(iVar10,in_stack_ffffffffffffff38),(int)((ulong)puVar16 >> 0x20));
      local_e = (bVar8 && (bVar7 && (bVar6 && (bVar5 && (bVar4 && (bVar3 && local_e)))))) && bVar9;
    }
    if ((in_R9B & 1) != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (in_stack_ffffffffffffff50,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)CONCAT44(in_ESI,in_EDX));
      local_88 = 0;
      while( true ) {
        sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_80);
        iVar13 = (int)((ulong)puVar16 >> 0x20);
        if (sVar11 <= local_88) break;
        pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&local_80,local_88);
        in_stack_ffffffffffffff10._M_current =
             (unsigned_long *)bitreverse<unsigned_long>(*pvVar12,0x40);
        pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&local_80,local_88);
        *pvVar12 = (value_type)in_stack_ffffffffffffff10._M_current;
        local_88 = local_88 + 1;
      }
      __last._M_current = (unsigned_long *)&local_80;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_fffffffffffffef8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_fffffffffffffef8);
      std::
      sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (in_stack_ffffffffffffff10,__last);
      bVar3 = CountLowbitsCollisions<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(iVar10,in_stack_ffffffffffffff38),iVar13);
      bVar4 = CountLowbitsCollisions<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(iVar10,in_stack_ffffffffffffff38),iVar13);
      bVar5 = CountLowbitsCollisions<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(iVar10,in_stack_ffffffffffffff38),iVar13);
      bVar6 = TestLowbitsCollisions<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(iVar10,in_stack_ffffffffffffff38));
      bVar7 = CountLowbitsCollisions<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(iVar10,in_stack_ffffffffffffff38),iVar13);
      bVar8 = CountLowbitsCollisions<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(iVar10,in_stack_ffffffffffffff38),iVar13);
      local_e = (bVar7 & bVar6 & bVar5 & bVar4 & bVar3 & local_e & bVar8) != 0;
      memset(&stack0xffffffffffffff50,0,0x18);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x14f80a);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::swap
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_ffffffffffffff10._M_current,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__last._M_current);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_ffffffffffffff10._M_current);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_ffffffffffffff10._M_current);
    }
    HashSet<unsigned_long>::~HashSet((HashSet<unsigned_long> *)0x14f840);
  }
  if (uVar2 != 0) {
    bVar3 = TestDistribution<unsigned_long>
                      (in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
    local_e = (local_e & bVar3) != 0;
  }
  return local_e;
}

Assistant:

bool TestHashList ( std::vector<hashtype> & hashes, bool drawDiagram,
                    bool testCollision = true, bool testDist = true,
                    bool testHighBits = true, bool testLowBits = true )
{
  bool result = true;

  if(testCollision)
  {
    size_t count = hashes.size();
    double expected = EstimateNbCollisions(count, sizeof(hashtype) * 8);
    printf("Testing collisions (%3i-bit)     - Expected %12.1f, ",
           (int)sizeof(hashtype)*8, expected);

    double collcount = 0;
    HashSet<hashtype> collisions;
    collcount = FindCollisions(hashes, collisions, 1000);
    printf("actual %6i (%.2fx)", (int)collcount, collcount / expected);

    if(sizeof(hashtype) == sizeof(uint32_t))
    {
    // 2x expected collisions = fail

    // #TODO - collision failure cutoff needs to be expressed as a standard deviation instead
    // of a scale factor, otherwise we fail erroneously if there are a small expected number
    // of collisions

        if(double(collcount) / double(expected) > 2.0)
        {
          printf(" !!!!!");
          result = false;
        }
    }
    else
    {
      // For all hashes larger than 32 bits, _any_ collisions are a failure.

      if(collcount > 0)
      {
        printf(" !!!!!");
        result = false;
        //if(drawDiagram) PrintCollisions(hashes, collisions);
      }
    }

    printf("\n");

    if (testHighBits) {
      result &= CountHighbitsCollisions(hashes, 256);
      result &= CountHighbitsCollisions(hashes, 128);
      result &= CountHighbitsCollisions(hashes,  64);
      result &= CountHighbitsCollisions(hashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountHighbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestHighbitsCollisions(hashes);
      result &= CountHighbitsCollisions(hashes,   12);
      result &= CountHighbitsCollisions(hashes,   8);
    }
    if (testLowBits) {
      // reverse: bitwise flip the hashes. lowest bits first
      std::vector<hashtype> revhashes = hashes;
      for (size_t i = 0; i < revhashes.size(); i++) {
        revhashes[i] = bitreverse(revhashes[i]);
      }
      std::sort(revhashes.begin(), revhashes.end());

      result &= CountLowbitsCollisions(revhashes, 128);
      result &= CountLowbitsCollisions(revhashes,  64);
      result &= CountLowbitsCollisions(revhashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountLowbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestLowbitsCollisions(revhashes);
      result &= CountLowbitsCollisions(revhashes,   12);
      result &= CountLowbitsCollisions(revhashes,   8);

      std::vector<hashtype>().swap(revhashes);
      //revhashes.clear();
    }
  }


  //----------

  if(testDist)
  {
    result &= TestDistribution(hashes,drawDiagram);
  }

  return result;
}